

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseAtExit(void)

{
  char **__ptr;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  linenoiseDisableRawMode(0);
  __ptr = history;
  if (history != (char **)0x0) {
    uVar2 = (ulong)(uint)history_len;
    if (history_len < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      free(__ptr[uVar1]);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void linenoiseAtExit(void) {
    linenoiseDisableRawMode(STDIN_FILENO);
    freeHistory();
}